

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_saved(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *x_00;
  t_pd p_Var1;
  int iVar2;
  _gobj **pp_Var3;
  
  pp_Var3 = &x->gl_list;
  while (x_00 = (_glist *)*pp_Var3, x_00 != (_glist *)0x0) {
    p_Var1 = (x_00->gl_obj).te_g.g_pd;
    if (p_Var1 == savestate_class) {
      outlet_list((_outlet *)x_00->gl_list,(t_symbol *)0x0,argc,argv);
    }
    else if (p_Var1 == canvas_class) {
      iVar2 = canvas_isabstraction(x_00);
      if (iVar2 == 0) {
        canvas_saved(x_00,s,argc,argv);
      }
    }
    pp_Var3 = &(x_00->gl_obj).te_g.g_next;
  }
  return;
}

Assistant:

void canvas_saved(t_glist *x, t_symbol *s, int argc, t_atom *argv)
{
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
        if (g->g_pd == savestate_class)
            outlet_list(((t_savestate *)g)->x_stateout, 0, argc, argv);
        else if (g->g_pd == canvas_class && !canvas_isabstraction((t_canvas *)g))
            canvas_saved((t_glist *)g, s, argc, argv);
}